

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall mario::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  Functor FStack_58;
  _Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::TimerId))(mario::TimerId)> local_38;
  
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*,_mario::TimerId>.
  super__Tuple_impl<1UL,_mario::TimerId>.super__Head_base<1UL,_mario::TimerId,_false>._M_head_impl.
  _seq = timerId._seq;
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*,_mario::TimerId>.
  super__Tuple_impl<1UL,_mario::TimerId>.super__Head_base<1UL,_mario::TimerId,_false>._M_head_impl.
  _value = timerId._value;
  this_00 = this->_loop;
  local_38._M_f = (offset_in_TimerQueue_to_subr)cancelInLoop;
  local_38._8_8_ = 0;
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*,_mario::TimerId>.
  super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*,mario::TimerId))(mario::TimerId)>,void>
            ((function<void()> *)&FStack_58,&local_38);
  EventLoop::runInLoop(this_00,&FStack_58);
  std::_Function_base::~_Function_base(&FStack_58.super__Function_base);
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId) {
    _loop->runInLoop(
            std::bind(&TimerQueue::cancelInLoop, this, timerId)
            );
}